

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpEmpty
               (OpCode op,OpLayoutEmpty *data,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  PropertyIdArray *pPVar1;
  ScriptContext *this;
  PropertyRecord *pPVar2;
  undefined6 in_register_0000003a;
  uint i;
  ulong uVar3;
  
  if ((int)CONCAT62(in_register_0000003a,op) == 0xdc) {
    pPVar1 = FunctionBody::GetFormalsPropIdArray(dumpFunction,true);
    this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
    Output::Print(L" %d [",(ulong)pPVar1->count);
    for (uVar3 = 0; (uVar3 < 3 && (uVar3 < pPVar1->count)); uVar3 = uVar3 + 1) {
      pPVar2 = ScriptContext::GetPropertyName(this,(&pPVar1[1].count)[uVar3]);
      if (uVar3 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%s",pPVar2 + 1);
    }
    Output::Print(L"]");
    return;
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpEmpty(OpCode op, const unaligned OpLayoutEmpty * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::CommitScope:
            {
                const Js::PropertyIdArray *propIds = dumpFunction->GetFormalsPropIdArray();
                ScriptContext* scriptContext = dumpFunction->GetScriptContext();
                Output::Print(_u(" %d ["), propIds->count);
                for (uint i = 0; i < propIds->count && i < 3; i++)
                {
                    PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propIds->elements[i]);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), pPropertyName->GetBuffer());
                }
                Output::Print(_u("]"));
                break;
            }
        }
    }